

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_double_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_fe *rzr)

{
  secp256k1_fe *psVar1;
  uint64_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  ulong uVar364;
  ulong uVar365;
  ulong uVar366;
  ulong uVar367;
  ulong uVar368;
  ulong uVar369;
  ulong uVar370;
  ulong uVar371;
  ulong uVar372;
  uint64_t uVar373;
  uint64_t uVar374;
  ulong uVar375;
  ulong uVar376;
  ulong uVar377;
  ulong uVar378;
  uint64_t uVar379;
  ulong uVar380;
  ulong uVar381;
  ulong uVar382;
  ulong uVar383;
  long lVar384;
  ulong uVar385;
  ulong uVar386;
  ulong uVar387;
  long lVar388;
  ulong uVar389;
  ulong uVar390;
  ulong uVar391;
  ulong uVar392;
  uint64_t uVar393;
  uint64_t uVar394;
  uint64_t uVar395;
  uint64_t tmp3_2;
  uint64_t tmp3_3;
  uint64_t tmp3_4;
  secp256k1_fe t3;
  uint64_t tmp3_1;
  secp256k1_fe t2;
  secp256k1_fe t1;
  
  if (a->infinity == 0) {
    if (rzr != (secp256k1_fe *)0x0) {
      rzr->n[4] = (a->y).n[4];
      uVar373 = (a->y).n[0];
      uVar374 = (a->y).n[1];
      uVar379 = (a->y).n[3];
      rzr->n[2] = (a->y).n[2];
      rzr->n[3] = uVar379;
      rzr->n[0] = uVar373;
      rzr->n[1] = uVar374;
      secp256k1_fe_normalize_weak(rzr);
      rzr->n[0] = rzr->n[0] << 1;
      rzr->n[1] = rzr->n[1] << 1;
      rzr->n[2] = rzr->n[2] << 1;
      rzr->n[3] = rzr->n[3] << 1;
      rzr->n[4] = rzr->n[4] << 1;
    }
    r->infinity = a->infinity;
    psVar1 = &a->y;
    uVar372 = (a->z).n[0];
    uVar381 = (a->z).n[1];
    uVar383 = (a->z).n[2];
    uVar375 = (a->z).n[3];
    uVar385 = (a->z).n[4];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = psVar1->n[0];
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar375;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (a->y).n[1];
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar383;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (a->y).n[2];
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar381;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (a->y).n[3];
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar372;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (a->y).n[4];
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar385;
    uVar365 = SUB168(auVar7 * auVar177,0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar365 & 0xfffffffffffff;
    auVar3 = auVar4 * auVar174 + auVar3 * auVar173 + auVar5 * auVar175 + auVar6 * auVar176 +
             auVar8 * ZEXT816(0x1000003d10);
    uVar370 = auVar3._0_8_;
    auVar315._8_8_ = 0;
    auVar315._0_8_ = uVar370 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = psVar1->n[0];
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar385;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (a->y).n[1];
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar375;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (a->y).n[2];
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar383;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (a->y).n[3];
    auVar181._8_8_ = 0;
    auVar181._0_8_ = uVar381;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (a->y).n[4];
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uVar372;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar365 >> 0x34 | SUB168(auVar7 * auVar177,8) << 0xc;
    auVar3 = auVar9 * auVar178 + auVar315 + auVar10 * auVar179 + auVar11 * auVar180 +
             auVar12 * auVar181 + auVar13 * auVar182 + auVar14 * ZEXT816(0x1000003d10);
    uVar365 = auVar3._0_8_;
    auVar316._8_8_ = 0;
    auVar316._0_8_ = uVar365 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = psVar1->n[0];
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar372;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (a->y).n[1];
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar385;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (a->y).n[2];
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar375;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (a->y).n[3];
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar383;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = (a->y).n[4];
    auVar187._8_8_ = 0;
    auVar187._0_8_ = uVar381;
    auVar3 = auVar16 * auVar184 + auVar316 + auVar17 * auVar185 + auVar18 * auVar186 +
             auVar19 * auVar187;
    uVar371 = auVar3._0_8_;
    auVar318._8_8_ = 0;
    auVar318._0_8_ = uVar371 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = (uVar371 & 0xfffffffffffff) << 4 | (uVar365 & 0xfffffffffffff) >> 0x30;
    auVar3 = auVar15 * auVar183 + ZEXT816(0x1000003d1) * auVar188;
    uVar371 = auVar3._0_8_;
    (r->z).n[0] = uVar371 & 0xfffffffffffff;
    auVar317._8_8_ = 0;
    auVar317._0_8_ = uVar371 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = psVar1->n[0];
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar381;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = (a->y).n[1];
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar372;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (a->y).n[2];
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar385;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (a->y).n[3];
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar375;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = (a->y).n[4];
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar383;
    auVar4 = auVar22 * auVar191 + auVar318 + auVar23 * auVar192 + auVar24 * auVar193;
    uVar371 = auVar4._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar371 & 0xfffffffffffff;
    auVar3 = auVar20 * auVar189 + auVar317 + auVar21 * auVar190 + auVar25 * ZEXT816(0x1000003d10);
    uVar380 = auVar3._0_8_;
    auVar320._8_8_ = 0;
    auVar320._0_8_ = uVar371 >> 0x34 | auVar4._8_8_ << 0xc;
    (r->z).n[1] = uVar380 & 0xfffffffffffff;
    auVar319._8_8_ = 0;
    auVar319._0_8_ = uVar380 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = psVar1->n[0];
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar383;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = (a->y).n[1];
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar381;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (a->y).n[2];
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar372;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = (a->y).n[3];
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar385;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (a->y).n[4];
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar375;
    auVar4 = auVar29 * auVar197 + auVar320 + auVar30 * auVar198;
    uVar372 = auVar4._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar372 & 0xfffffffffffff;
    auVar3 = auVar26 * auVar194 + auVar319 + auVar27 * auVar195 + auVar28 * auVar196 +
             auVar31 * ZEXT816(0x1000003d10);
    uVar381 = auVar3._0_8_;
    (r->z).n[2] = uVar381 & 0xfffffffffffff;
    auVar321._8_8_ = 0;
    auVar321._0_8_ = (uVar381 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar370 & 0xfffffffffffff);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar372 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar321 = auVar32 * ZEXT816(0x1000003d10) + auVar321;
    uVar372 = auVar321._0_8_;
    (r->z).n[3] = uVar372 & 0xfffffffffffff;
    (r->z).n[4] = (uVar372 >> 0x34 | auVar321._8_8_ << 0xc) + (uVar365 & 0xffffffffffff);
    (r->z).n[0] = (r->z).n[0] << 1;
    puVar2 = (r->z).n + 1;
    *puVar2 = *puVar2 << 1;
    puVar2 = (r->z).n + 2;
    *puVar2 = *puVar2 << 1;
    puVar2 = (r->z).n + 3;
    *puVar2 = *puVar2 << 1;
    puVar2 = (r->z).n + 4;
    *puVar2 = *puVar2 << 1;
    uVar372 = (a->x).n[0];
    uVar381 = (a->x).n[1];
    uVar383 = (a->x).n[2];
    uVar375 = (a->x).n[3];
    uVar385 = (a->x).n[4];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar372 * 2;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar375;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar381 * 2;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar383;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar385;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar385;
    uVar365 = SUB168(auVar35 * auVar201,0);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar365 & 0xfffffffffffff;
    auVar3 = auVar34 * auVar200 + auVar33 * auVar199 + auVar36 * ZEXT816(0x1000003d10);
    uVar370 = auVar3._0_8_;
    auVar322._8_8_ = 0;
    auVar322._0_8_ = uVar370 >> 0x34 | auVar3._8_8_ << 0xc;
    uVar385 = uVar385 * 2;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar372;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar385;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar381 * 2;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar375;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar383;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar383;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar365 >> 0x34 | SUB168(auVar35 * auVar201,8) << 0xc;
    auVar3 = auVar37 * auVar202 + auVar322 + auVar38 * auVar203 + auVar39 * auVar204 +
             auVar40 * ZEXT816(0x1000003d10);
    uVar371 = auVar3._0_8_;
    auVar323._8_8_ = 0;
    auVar323._0_8_ = uVar371 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar372;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar372;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar381;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar385;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar383 * 2;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar375;
    auVar3 = auVar42 * auVar206 + auVar323 + auVar43 * auVar207;
    uVar365 = auVar3._0_8_;
    auVar325._8_8_ = 0;
    auVar325._0_8_ = uVar365 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = (uVar365 & 0xfffffffffffff) << 4 | (uVar371 & 0xfffffffffffff) >> 0x30;
    auVar3 = auVar41 * auVar205 + ZEXT816(0x1000003d1) * auVar208;
    uVar380 = auVar3._0_8_;
    uVar365 = uVar380 & 0xfffffffffffff;
    auVar324._8_8_ = 0;
    auVar324._0_8_ = uVar380 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar372 * 2;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar381;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar383;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar385;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar375;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = uVar375;
    auVar4 = auVar45 * auVar210 + auVar325 + auVar46 * auVar211;
    uVar380 = auVar4._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar380 & 0xfffffffffffff;
    auVar3 = auVar44 * auVar209 + auVar324 + auVar47 * ZEXT816(0x1000003d10);
    uVar382 = auVar3._0_8_;
    auVar327._8_8_ = 0;
    auVar327._0_8_ = uVar380 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar366 = uVar382 & 0xfffffffffffff;
    auVar326._8_8_ = 0;
    auVar326._0_8_ = uVar382 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar372 * 2;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = uVar383;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar381;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = uVar381;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar375;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uVar385;
    auVar327 = auVar50 * auVar214 + auVar327;
    uVar372 = auVar327._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar372 & 0xfffffffffffff;
    auVar3 = auVar48 * auVar212 + auVar326 + auVar49 * auVar213 + auVar51 * ZEXT816(0x1000003d10);
    uVar383 = auVar3._0_8_;
    uVar381 = uVar383 & 0xfffffffffffff;
    auVar328._8_8_ = 0;
    auVar328._0_8_ = (uVar383 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar370 & 0xfffffffffffff);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar372 >> 0x34 | auVar327._8_8_ << 0xc;
    auVar328 = auVar52 * ZEXT816(0x1000003d10) + auVar328;
    uVar372 = auVar328._0_8_;
    lVar384 = (uVar372 >> 0x34 | auVar328._8_8_ << 0xc) + (uVar371 & 0xffffffffffff);
    uVar370 = uVar365 * 3;
    uVar371 = uVar366 * 3;
    uVar380 = uVar381 * 3;
    uVar382 = (uVar372 & 0xfffffffffffff) * 3;
    uVar364 = lVar384 * 3;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar365 * 6;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar382;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar366 * 6;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar380;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar364;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = uVar364;
    uVar383 = SUB168(auVar55 * auVar217,0);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar383 & 0xfffffffffffff;
    auVar3 = auVar54 * auVar216 + auVar53 * auVar215 + auVar56 * ZEXT816(0x1000003d10);
    uVar375 = auVar3._0_8_;
    auVar329._8_8_ = 0;
    auVar329._0_8_ = uVar375 >> 0x34 | auVar3._8_8_ << 0xc;
    uVar372 = lVar384 * 6;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar370;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = uVar372;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar366 * 6;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar382;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar380;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar380;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar383 >> 0x34 | SUB168(auVar55 * auVar217,8) << 0xc;
    auVar3 = auVar57 * auVar218 + auVar329 + auVar58 * auVar219 + auVar59 * auVar220 +
             auVar60 * ZEXT816(0x1000003d10);
    uVar383 = auVar3._0_8_;
    auVar330._8_8_ = 0;
    auVar330._0_8_ = uVar383 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar370;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = uVar370;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar371;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = uVar372;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar381 * 6;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = uVar382;
    auVar3 = auVar62 * auVar222 + auVar330 + auVar63 * auVar223;
    uVar381 = auVar3._0_8_;
    auVar332._8_8_ = 0;
    auVar332._0_8_ = uVar381 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = (uVar381 & 0xfffffffffffff) << 4 | (uVar383 & 0xfffffffffffff) >> 0x30;
    auVar3 = auVar61 * auVar221 + ZEXT816(0x1000003d1) * auVar224;
    uVar381 = auVar3._0_8_;
    uVar366 = uVar381 & 0xfffffffffffff;
    auVar331._8_8_ = 0;
    auVar331._0_8_ = uVar381 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar365 * 6;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = uVar371;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar380;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = uVar372;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar382;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = uVar382;
    auVar4 = auVar65 * auVar226 + auVar332 + auVar66 * auVar227;
    uVar381 = auVar4._0_8_;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar381 & 0xfffffffffffff;
    auVar3 = auVar64 * auVar225 + auVar331 + auVar67 * ZEXT816(0x1000003d10);
    uVar385 = auVar3._0_8_;
    auVar334._8_8_ = 0;
    auVar334._0_8_ = uVar381 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar367 = uVar385 & 0xfffffffffffff;
    auVar333._8_8_ = 0;
    auVar333._0_8_ = uVar385 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar365 * 6;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar380;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar371;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = uVar371;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar382;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = uVar372;
    auVar334 = auVar70 * auVar230 + auVar334;
    uVar372 = auVar334._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar372 & 0xfffffffffffff;
    auVar3 = auVar68 * auVar228 + auVar333 + auVar69 * auVar229 + auVar71 * ZEXT816(0x1000003d10);
    uVar381 = auVar3._0_8_;
    uVar368 = uVar381 & 0xfffffffffffff;
    auVar335._8_8_ = 0;
    auVar335._0_8_ = (uVar381 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar375 & 0xfffffffffffff);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar372 >> 0x34 | auVar334._8_8_ << 0xc;
    auVar335 = auVar72 * ZEXT816(0x1000003d10) + auVar335;
    uVar372 = auVar335._0_8_;
    uVar369 = uVar372 & 0xfffffffffffff;
    lVar384 = (uVar372 >> 0x34 | auVar335._8_8_ << 0xc) + (uVar383 & 0xffffffffffff);
    uVar372 = psVar1->n[0];
    uVar381 = (a->y).n[1];
    uVar383 = (a->y).n[2];
    uVar375 = (a->y).n[3];
    uVar385 = (a->y).n[4];
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar372 * 2;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = uVar375;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar381 * 2;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar383;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar385;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar385;
    uVar365 = SUB168(auVar75 * auVar233,0);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar365 & 0xfffffffffffff;
    auVar3 = auVar74 * auVar232 + auVar73 * auVar231 + auVar76 * ZEXT816(0x1000003d10);
    uVar376 = auVar3._0_8_;
    auVar336._8_8_ = 0;
    auVar336._0_8_ = uVar376 >> 0x34 | auVar3._8_8_ << 0xc;
    uVar385 = uVar385 * 2;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar372;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uVar385;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar381 * 2;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar375;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar383;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = uVar383;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar365 >> 0x34 | SUB168(auVar75 * auVar233,8) << 0xc;
    auVar3 = auVar77 * auVar234 + auVar336 + auVar78 * auVar235 + auVar79 * auVar236 +
             auVar80 * ZEXT816(0x1000003d10);
    uVar365 = auVar3._0_8_;
    auVar337._8_8_ = 0;
    auVar337._0_8_ = uVar365 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar372;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar372;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar381;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar385;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar383 * 2;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar375;
    auVar3 = auVar82 * auVar238 + auVar337 + auVar83 * auVar239;
    uVar377 = auVar3._0_8_;
    auVar339._8_8_ = 0;
    auVar339._0_8_ = uVar377 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = (uVar377 & 0xfffffffffffff) << 4 | (uVar365 & 0xfffffffffffff) >> 0x30;
    auVar3 = auVar81 * auVar237 + ZEXT816(0x1000003d1) * auVar240;
    uVar386 = auVar3._0_8_;
    uVar377 = uVar386 & 0xfffffffffffff;
    auVar338._8_8_ = 0;
    auVar338._0_8_ = uVar386 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar372 * 2;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = uVar381;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar383;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = uVar385;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar375;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar375;
    auVar4 = auVar85 * auVar242 + auVar339 + auVar86 * auVar243;
    uVar386 = auVar4._0_8_;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar386 & 0xfffffffffffff;
    auVar3 = auVar84 * auVar241 + auVar338 + auVar87 * ZEXT816(0x1000003d10);
    uVar387 = auVar3._0_8_;
    auVar341._8_8_ = 0;
    auVar341._0_8_ = uVar386 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar386 = uVar387 & 0xfffffffffffff;
    auVar340._8_8_ = 0;
    auVar340._0_8_ = uVar387 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar372 * 2;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar383;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar381;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = uVar381;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar375;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar385;
    auVar341 = auVar90 * auVar246 + auVar341;
    uVar372 = auVar341._0_8_;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar372 & 0xfffffffffffff;
    auVar3 = auVar88 * auVar244 + auVar340 + auVar89 * auVar245 + auVar91 * ZEXT816(0x1000003d10);
    uVar381 = auVar3._0_8_;
    uVar387 = uVar381 & 0xfffffffffffff;
    auVar342._8_8_ = 0;
    auVar342._0_8_ = (uVar381 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar376 & 0xfffffffffffff);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar372 >> 0x34 | auVar341._8_8_ << 0xc;
    auVar342 = auVar92 * ZEXT816(0x1000003d10) + auVar342;
    uVar375 = auVar342._0_8_;
    lVar388 = (uVar375 >> 0x34 | auVar342._8_8_ << 0xc) + (uVar365 & 0xffffffffffff);
    uVar372 = uVar377 * 2;
    uVar381 = uVar386 * 2;
    uVar383 = uVar387 * 2;
    uVar375 = (uVar375 & 0xfffffffffffff) << 1;
    uVar385 = lVar388 * 2;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar377 << 2;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar375;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar386 << 2;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = uVar383;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar385;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = uVar385;
    uVar376 = SUB168(auVar95 * auVar249,0);
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar376 & 0xfffffffffffff;
    auVar3 = auVar94 * auVar248 + auVar93 * auVar247 + auVar96 * ZEXT816(0x1000003d10);
    uVar378 = auVar3._0_8_;
    auVar343._8_8_ = 0;
    auVar343._0_8_ = uVar378 >> 0x34 | auVar3._8_8_ << 0xc;
    uVar365 = lVar388 * 4;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar372;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = uVar365;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar386 << 2;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = uVar375;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar383;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = uVar383;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar376 >> 0x34 | SUB168(auVar95 * auVar249,8) << 0xc;
    auVar3 = auVar97 * auVar250 + auVar343 + auVar98 * auVar251 + auVar99 * auVar252 +
             auVar100 * ZEXT816(0x1000003d10);
    uVar376 = auVar3._0_8_;
    auVar344._8_8_ = 0;
    auVar344._0_8_ = uVar376 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar372;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = uVar372;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar381;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar365;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar387 << 2;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar375;
    auVar3 = auVar102 * auVar254 + auVar344 + auVar103 * auVar255;
    uVar386 = auVar3._0_8_;
    auVar346._8_8_ = 0;
    auVar346._0_8_ = uVar386 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = (uVar386 & 0xfffffffffffff) << 4 | (uVar376 & 0xfffffffffffff) >> 0x30;
    auVar3 = auVar101 * auVar253 + ZEXT816(0x1000003d1) * auVar256;
    uVar389 = auVar3._0_8_;
    auVar345._8_8_ = 0;
    auVar345._0_8_ = uVar389 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar377 << 2;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar381;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar383;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar365;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar375;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = uVar375;
    auVar4 = auVar105 * auVar258 + auVar346 + auVar106 * auVar259;
    uVar386 = auVar4._0_8_;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar386 & 0xfffffffffffff;
    auVar3 = auVar104 * auVar257 + auVar345 + auVar107 * ZEXT816(0x1000003d10);
    uVar390 = auVar3._0_8_;
    auVar348._8_8_ = 0;
    auVar348._0_8_ = uVar386 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar347._8_8_ = 0;
    auVar347._0_8_ = uVar390 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar377 << 2;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = uVar383;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar381;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = uVar381;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar375;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = uVar365;
    auVar348 = auVar110 * auVar262 + auVar348;
    uVar365 = auVar348._0_8_;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar365 & 0xfffffffffffff;
    auVar3 = auVar108 * auVar260 + auVar347 + auVar109 * auVar261 + auVar111 * ZEXT816(0x1000003d10)
    ;
    uVar391 = auVar3._0_8_;
    auVar349._8_8_ = 0;
    auVar349._0_8_ = (uVar391 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar378 & 0xfffffffffffff);
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar365 >> 0x34 | auVar348._8_8_ << 0xc;
    auVar349 = auVar112 * ZEXT816(0x1000003d10) + auVar349;
    uVar378 = auVar349._0_8_;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = (a->x).n[0];
    auVar263._8_8_ = 0;
    auVar263._0_8_ = uVar375;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = (a->x).n[1];
    auVar264._8_8_ = 0;
    auVar264._0_8_ = uVar383;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = (a->x).n[2];
    auVar265._8_8_ = 0;
    auVar265._0_8_ = uVar381;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = (a->x).n[3];
    auVar266._8_8_ = 0;
    auVar266._0_8_ = uVar372;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = (a->x).n[4];
    auVar267._8_8_ = 0;
    auVar267._0_8_ = uVar385;
    uVar365 = SUB168(auVar117 * auVar267,0);
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar365 & 0xfffffffffffff;
    auVar3 = auVar114 * auVar264 + auVar113 * auVar263 + auVar115 * auVar265 + auVar116 * auVar266 +
             auVar118 * ZEXT816(0x1000003d10);
    uVar386 = auVar3._0_8_;
    auVar350._8_8_ = 0;
    auVar350._0_8_ = uVar386 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = (a->x).n[0];
    auVar268._8_8_ = 0;
    auVar268._0_8_ = uVar385;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = (a->x).n[1];
    auVar269._8_8_ = 0;
    auVar269._0_8_ = uVar375;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = (a->x).n[2];
    auVar270._8_8_ = 0;
    auVar270._0_8_ = uVar383;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = (a->x).n[3];
    auVar271._8_8_ = 0;
    auVar271._0_8_ = uVar381;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = (a->x).n[4];
    auVar272._8_8_ = 0;
    auVar272._0_8_ = uVar372;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar365 >> 0x34 | SUB168(auVar117 * auVar267,8) << 0xc;
    auVar3 = auVar119 * auVar268 + auVar350 + auVar120 * auVar269 + auVar121 * auVar270 +
             auVar122 * auVar271 + auVar123 * auVar272 + auVar124 * ZEXT816(0x1000003d10);
    uVar387 = auVar3._0_8_;
    auVar351._8_8_ = 0;
    auVar351._0_8_ = uVar387 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = (a->x).n[0];
    auVar273._8_8_ = 0;
    auVar273._0_8_ = uVar372;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = (a->x).n[1];
    auVar274._8_8_ = 0;
    auVar274._0_8_ = uVar385;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = (a->x).n[2];
    auVar275._8_8_ = 0;
    auVar275._0_8_ = uVar375;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = (a->x).n[3];
    auVar276._8_8_ = 0;
    auVar276._0_8_ = uVar383;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = (a->x).n[4];
    auVar277._8_8_ = 0;
    auVar277._0_8_ = uVar381;
    auVar3 = auVar126 * auVar274 + auVar351 + auVar127 * auVar275 + auVar128 * auVar276 +
             auVar129 * auVar277;
    uVar365 = auVar3._0_8_;
    auVar353._8_8_ = 0;
    auVar353._0_8_ = uVar365 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = (uVar365 & 0xfffffffffffff) << 4 | (uVar387 & 0xfffffffffffff) >> 0x30;
    auVar3 = auVar125 * auVar273 + ZEXT816(0x1000003d1) * auVar278;
    uVar377 = auVar3._0_8_;
    uVar365 = uVar377 & 0xfffffffffffff;
    auVar352._8_8_ = 0;
    auVar352._0_8_ = uVar377 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = (a->x).n[0];
    auVar279._8_8_ = 0;
    auVar279._0_8_ = uVar381;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = (a->x).n[1];
    auVar280._8_8_ = 0;
    auVar280._0_8_ = uVar372;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = (a->x).n[2];
    auVar281._8_8_ = 0;
    auVar281._0_8_ = uVar385;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = (a->x).n[3];
    auVar282._8_8_ = 0;
    auVar282._0_8_ = uVar375;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = (a->x).n[4];
    auVar283._8_8_ = 0;
    auVar283._0_8_ = uVar383;
    auVar4 = auVar132 * auVar281 + auVar353 + auVar133 * auVar282 + auVar134 * auVar283;
    uVar377 = auVar4._0_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = uVar377 & 0xfffffffffffff;
    auVar3 = auVar130 * auVar279 + auVar352 + auVar131 * auVar280 + auVar135 * ZEXT816(0x1000003d10)
    ;
    uVar392 = auVar3._0_8_;
    auVar355._8_8_ = 0;
    auVar355._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar377 = uVar392 & 0xfffffffffffff;
    auVar354._8_8_ = 0;
    auVar354._0_8_ = uVar392 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = (a->x).n[0];
    auVar284._8_8_ = 0;
    auVar284._0_8_ = uVar383;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = (a->x).n[1];
    auVar285._8_8_ = 0;
    auVar285._0_8_ = uVar381;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = (a->x).n[2];
    auVar286._8_8_ = 0;
    auVar286._0_8_ = uVar372;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = (a->x).n[3];
    auVar287._8_8_ = 0;
    auVar287._0_8_ = uVar385;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = (a->x).n[4];
    auVar288._8_8_ = 0;
    auVar288._0_8_ = uVar375;
    auVar4 = auVar139 * auVar287 + auVar355 + auVar140 * auVar288;
    uVar372 = auVar4._0_8_;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar372 & 0xfffffffffffff;
    auVar3 = auVar136 * auVar284 + auVar354 + auVar137 * auVar285 + auVar138 * auVar286 +
             auVar141 * ZEXT816(0x1000003d10);
    uVar381 = auVar3._0_8_;
    uVar383 = uVar381 & 0xfffffffffffff;
    auVar356._8_8_ = 0;
    auVar356._0_8_ = (uVar381 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar386 & 0xfffffffffffff);
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar372 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar356 = auVar142 * ZEXT816(0x1000003d10) + auVar356;
    uVar372 = auVar356._0_8_;
    uVar375 = uVar372 & 0xfffffffffffff;
    uVar393 = (uVar372 >> 0x34 | auVar356._8_8_ << 0xc) + (uVar387 & 0xffffffffffff);
    (r->x).n[0] = uVar365;
    (r->x).n[1] = uVar377;
    (r->x).n[2] = uVar383;
    (r->x).n[3] = uVar375;
    (r->x).n[4] = uVar393;
    uVar373 = (r->x).n[1];
    uVar374 = (r->x).n[2];
    uVar379 = (r->x).n[3];
    uVar394 = (r->x).n[0] * -4 + 0x9ffff5ffffd9d6;
    (r->x).n[0] = uVar394;
    uVar395 = uVar373 * -4 + 0x9ffffffffffff6;
    (r->x).n[1] = uVar395;
    uVar374 = uVar374 * -4 + 0x9ffffffffffff6;
    (r->x).n[2] = uVar374;
    uVar373 = uVar379 * -4 + 0x9ffffffffffff6;
    (r->x).n[3] = uVar373;
    uVar379 = uVar393 * -4 + 0x9fffffffffff6;
    (r->x).n[4] = uVar379;
    (r->x).n[0] = uVar394 + uVar366;
    (r->x).n[1] = uVar395 + uVar367;
    (r->x).n[2] = uVar374 + uVar368;
    (r->x).n[3] = uVar373 + uVar369;
    (r->x).n[4] = uVar379 + lVar384;
    uVar372 = (0x3ffffbfffff0bc - uVar366) + uVar365 * 6;
    uVar381 = (0x3ffffffffffffc - uVar367) + uVar377 * 6;
    uVar383 = (0x3ffffffffffffc - uVar368) + uVar383 * 6;
    uVar375 = (0x3ffffffffffffc - uVar369) + uVar375 * 6;
    uVar385 = (0x3fffffffffffc - lVar384) + uVar393 * 6;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = uVar372;
    auVar289._8_8_ = 0;
    auVar289._0_8_ = uVar382;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar381;
    auVar290._8_8_ = 0;
    auVar290._0_8_ = uVar380;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar383;
    auVar291._8_8_ = 0;
    auVar291._0_8_ = uVar371;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar375;
    auVar292._8_8_ = 0;
    auVar292._0_8_ = uVar370;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar385;
    auVar293._8_8_ = 0;
    auVar293._0_8_ = uVar364;
    uVar365 = SUB168(auVar147 * auVar293,0);
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar365 & 0xfffffffffffff;
    auVar3 = auVar144 * auVar290 + auVar143 * auVar289 + auVar145 * auVar291 + auVar146 * auVar292 +
             auVar148 * ZEXT816(0x1000003d10);
    uVar366 = auVar3._0_8_;
    auVar357._8_8_ = 0;
    auVar357._0_8_ = uVar366 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar372;
    auVar294._8_8_ = 0;
    auVar294._0_8_ = uVar364;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar381;
    auVar295._8_8_ = 0;
    auVar295._0_8_ = uVar382;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar383;
    auVar296._8_8_ = 0;
    auVar296._0_8_ = uVar380;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar375;
    auVar297._8_8_ = 0;
    auVar297._0_8_ = uVar371;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar385;
    auVar298._8_8_ = 0;
    auVar298._0_8_ = uVar370;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar365 >> 0x34 | SUB168(auVar147 * auVar293,8) << 0xc;
    auVar3 = auVar149 * auVar294 + auVar357 + auVar150 * auVar295 + auVar151 * auVar296 +
             auVar152 * auVar297 + auVar153 * auVar298 + auVar154 * ZEXT816(0x1000003d10);
    uVar365 = auVar3._0_8_;
    auVar358._8_8_ = 0;
    auVar358._0_8_ = uVar365 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar372;
    auVar299._8_8_ = 0;
    auVar299._0_8_ = uVar370;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar381;
    auVar300._8_8_ = 0;
    auVar300._0_8_ = uVar364;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar383;
    auVar301._8_8_ = 0;
    auVar301._0_8_ = uVar382;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar375;
    auVar302._8_8_ = 0;
    auVar302._0_8_ = uVar380;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar385;
    auVar303._8_8_ = 0;
    auVar303._0_8_ = uVar371;
    auVar3 = auVar156 * auVar300 + auVar358 + auVar157 * auVar301 + auVar158 * auVar302 +
             auVar159 * auVar303;
    uVar367 = auVar3._0_8_;
    auVar360._8_8_ = 0;
    auVar360._0_8_ = uVar367 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar304._8_8_ = 0;
    auVar304._0_8_ = (uVar367 & 0xfffffffffffff) << 4 | (uVar365 & 0xfffffffffffff) >> 0x30;
    auVar3 = auVar155 * auVar299 + ZEXT816(0x1000003d1) * auVar304;
    uVar367 = auVar3._0_8_;
    (r->y).n[0] = uVar367 & 0xfffffffffffff;
    auVar359._8_8_ = 0;
    auVar359._0_8_ = uVar367 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar372;
    auVar305._8_8_ = 0;
    auVar305._0_8_ = uVar371;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar381;
    auVar306._8_8_ = 0;
    auVar306._0_8_ = uVar370;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar383;
    auVar307._8_8_ = 0;
    auVar307._0_8_ = uVar364;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar375;
    auVar308._8_8_ = 0;
    auVar308._0_8_ = uVar382;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar385;
    auVar309._8_8_ = 0;
    auVar309._0_8_ = uVar380;
    auVar4 = auVar162 * auVar307 + auVar360 + auVar163 * auVar308 + auVar164 * auVar309;
    uVar367 = auVar4._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar367 & 0xfffffffffffff;
    auVar3 = auVar160 * auVar305 + auVar359 + auVar161 * auVar306 + auVar165 * ZEXT816(0x1000003d10)
    ;
    uVar368 = auVar3._0_8_;
    auVar362._8_8_ = 0;
    auVar362._0_8_ = uVar367 >> 0x34 | auVar4._8_8_ << 0xc;
    (r->y).n[1] = uVar368 & 0xfffffffffffff;
    auVar361._8_8_ = 0;
    auVar361._0_8_ = uVar368 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar372;
    auVar310._8_8_ = 0;
    auVar310._0_8_ = uVar380;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar381;
    auVar311._8_8_ = 0;
    auVar311._0_8_ = uVar371;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar383;
    auVar312._8_8_ = 0;
    auVar312._0_8_ = uVar370;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar375;
    auVar313._8_8_ = 0;
    auVar313._0_8_ = uVar364;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar385;
    auVar314._8_8_ = 0;
    auVar314._0_8_ = uVar382;
    auVar4 = auVar169 * auVar313 + auVar362 + auVar170 * auVar314;
    uVar372 = auVar4._0_8_;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar372 & 0xfffffffffffff;
    auVar3 = auVar166 * auVar310 + auVar361 + auVar167 * auVar311 + auVar168 * auVar312 +
             auVar171 * ZEXT816(0x1000003d10);
    uVar381 = auVar3._0_8_;
    (r->y).n[2] = uVar381 & 0xfffffffffffff;
    auVar363._8_8_ = 0;
    auVar363._0_8_ = (uVar381 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar366 & 0xfffffffffffff);
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar372 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar363 = auVar172 * ZEXT816(0x1000003d10) + auVar363;
    uVar372 = auVar363._0_8_;
    (r->y).n[3] = uVar372 & 0xfffffffffffff;
    (r->y).n[4] = (uVar372 >> 0x34 | auVar363._8_8_ << 0xc) + (uVar365 & 0xffffffffffff);
    (r->y).n[0] = (r->y).n[0] + (uVar389 & 0xfffffffffffff) * -2 + 0x5ffff9ffffe91a;
    puVar2 = (r->y).n + 1;
    *puVar2 = *puVar2 + (uVar390 & 0xfffffffffffff) * -2 + 0x5ffffffffffffa;
    puVar2 = (r->y).n + 2;
    *puVar2 = *puVar2 + (uVar391 & 0xfffffffffffff) * -2 + 0x5ffffffffffffa;
    puVar2 = (r->y).n + 3;
    *puVar2 = *puVar2 + (uVar378 & 0xfffffffffffff) * -2 + 0x5ffffffffffffa;
    puVar2 = (r->y).n + 4;
    *puVar2 = *puVar2 + ((uVar378 >> 0x34 | auVar349._8_8_ << 0xc) + (uVar376 & 0xffffffffffff)) *
                        -2 + 0x5fffffffffffa;
  }
  else {
    r->infinity = 1;
    if (rzr != (secp256k1_fe *)0x0) {
      rzr->n[0] = 1;
      rzr->n[1] = 0;
      rzr->n[2] = 0;
      rzr->n[3] = 0;
      rzr->n[4] = 0;
    }
  }
  return;
}

Assistant:

static void secp256k1_gej_double_var(secp256k1_gej *r, const secp256k1_gej *a, secp256k1_fe *rzr) {
    /** For secp256k1, 2Q is infinity if and only if Q is infinity. This is because if 2Q = infinity,
     *  Q must equal -Q, or that Q.y == -(Q.y), or Q.y is 0. For a point on y^2 = x^3 + 7 to have
     *  y=0, x^3 must be -7 mod p. However, -7 has no cube root mod p.
     *
     *  Having said this, if this function receives a point on a sextic twist, e.g. by
     *  a fault attack, it is possible for y to be 0. This happens for y^2 = x^3 + 6,
     *  since -6 does have a cube root mod p. For this point, this function will not set
     *  the infinity flag even though the point doubles to infinity, and the result
     *  point will be gibberish (z = 0 but infinity = 0).
     */
    if (a->infinity) {
        r->infinity = 1;
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        return;
    }

    if (rzr != NULL) {
        *rzr = a->y;
        secp256k1_fe_normalize_weak(rzr);
        secp256k1_fe_mul_int(rzr, 2);
    }

    secp256k1_gej_double(r, a);
}